

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_all.cpp
# Opt level: O0

void __thiscall tst_helpers_all::atLeastOnePromiseReject_void(tst_helpers_all *this)

{
  initializer_list<QtPromise::QPromise<void>_> args;
  bool bVar1;
  QPromise<void> *local_130;
  bool local_122;
  bool local_121;
  QString local_120;
  QString local_108;
  QString local_f0;
  bool local_d6;
  bool local_d5;
  bool local_d4;
  bool local_d3;
  bool local_d2;
  bool local_d1 [7];
  bool local_ca;
  bool local_c9;
  QPromise<void> *local_c8;
  QPromise<void> local_c0;
  QPromise<void> local_b0;
  QPromise<void> local_a0;
  QPromise<void> local_90;
  QList<QtPromise::QPromise<void>_> local_80;
  undefined1 local_68 [8];
  QPromise<void> p;
  undefined1 local_50 [8];
  QPromise<void> p2;
  undefined1 local_30 [8];
  QPromise<void> p1;
  QPromise<void> p0;
  tst_helpers_all *this_local;
  
  QtPromise::resolve();
  QtPromise::resolve();
  QtPromise::QPromise<void>::QPromise<tst_helpers_all::atLeastOnePromiseReject_void()::__0>
            ((QPromise<void> *)local_50,
             (anon_class_1_0_00000001 *)((long)&p.super_QPromiseBase<void>.m_d.d + 7));
  local_c8 = &local_c0;
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            (local_c8,(QPromise<void> *)&p1.super_QPromiseBase<void>.m_d);
  local_c8 = &local_b0;
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            (local_c8,(QPromise<void> *)local_50);
  local_c8 = &local_a0;
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            (local_c8,(QPromise<void> *)local_30);
  local_90.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&local_c0;
  local_90.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)0x3;
  args._M_len = 3;
  args._M_array = (iterator)local_90.super_QPromiseBase<void>._vptr_QPromiseBase;
  QList<QtPromise::QPromise<void>_>::QList(&local_80,args);
  QtPromise::all<QList>((QtPromise *)local_68,&local_80);
  QList<QtPromise::QPromise<void>_>::~QList(&local_80);
  local_130 = &local_90;
  do {
    local_130 = local_130 + -1;
    QtPromise::QPromise<void>::~QPromise(local_130);
  } while (local_130 != &local_c0);
  local_c9 = QtPromise::QPromiseBase<void>::isFulfilled
                       ((QPromiseBase<void> *)&p1.super_QPromiseBase<void>.m_d);
  local_ca = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_c9,&local_ca,"p0.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                     ,0xae);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_d1[0] = QtPromise::QPromiseBase<void>::isFulfilled((QPromiseBase<void> *)local_30);
    local_d2 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_d1,&local_d2,"p1.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                       ,0xaf);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_d3 = QtPromise::QPromiseBase<void>::isPending((QPromiseBase<void> *)local_50);
      local_d4 = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_d3,&local_d4,"p2.isPending()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                         ,0xb0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_d5 = QtPromise::QPromiseBase<void>::isPending((QPromiseBase<void> *)local_68);
        local_d6 = true;
        bVar1 = QTest::qCompare<bool,bool>
                          (&local_d5,&local_d6,"p.isPending()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                           ,0xb1);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          QString::QString(&local_108);
          waitForError<QString>(&local_f0,(QPromise<void> *)local_68,&local_108);
          QString::QString(&local_120,"foo");
          bVar1 = QTest::qCompare(&local_f0,&local_120,"waitForError(p, QString{})",
                                  "QString{\"foo\"}",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                                  ,0xb2);
          QString::~QString(&local_120);
          QString::~QString(&local_f0);
          QString::~QString(&local_108);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_121 = QtPromise::QPromiseBase<void>::isRejected((QPromiseBase<void> *)local_50);
            local_122 = true;
            bVar1 = QTest::qCompare<bool,bool>
                              (&local_121,&local_122,"p2.isRejected()","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                               ,0xb3);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              local_d1[1] = false;
              local_d1[2] = false;
              local_d1[3] = false;
              local_d1[4] = false;
            }
            else {
              local_d1[1] = true;
              local_d1[2] = false;
              local_d1[3] = false;
              local_d1[4] = false;
            }
          }
          else {
            local_d1[1] = true;
            local_d1[2] = false;
            local_d1[3] = false;
            local_d1[4] = false;
          }
        }
        else {
          local_d1[1] = true;
          local_d1[2] = false;
          local_d1[3] = false;
          local_d1[4] = false;
        }
      }
      else {
        local_d1[1] = true;
        local_d1[2] = false;
        local_d1[3] = false;
        local_d1[4] = false;
      }
    }
    else {
      local_d1[1] = true;
      local_d1[2] = false;
      local_d1[3] = false;
      local_d1[4] = false;
    }
  }
  else {
    local_d1[1] = true;
    local_d1[2] = false;
    local_d1[3] = false;
    local_d1[4] = false;
  }
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_68);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_50);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_30);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&p1.super_QPromiseBase<void>.m_d);
  return;
}

Assistant:

void tst_helpers_all::atLeastOnePromiseReject_void()
{
    auto p0 = QtPromise::resolve();
    auto p1 = QtPromise::resolve();
    auto p2 = QtPromise::QPromise<void>{
        [](const QtPromise::QPromiseResolve<void>&, const QtPromise::QPromiseReject<void>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    auto p = QtPromise::all(QVector<QtPromise::QPromise<void>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p2.isRejected(), true);
}